

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  
LAB_00118bae:
  do {
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar2 = (*(s->io).eof)(s->io_user_data);
      if (iVar2 == 0) goto LAB_00118bd8;
      if (s->read_from_callbacks != 0) goto LAB_00118bc8;
LAB_00118bf4:
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar2 = (*(s->io).eof)(s->io_user_data);
        if (iVar2 == 0) goto LAB_00118c1e;
        if (s->read_from_callbacks == 0) {
          return;
        }
      }
      if (s->img_buffer_end <= s->img_buffer) {
        return;
      }
LAB_00118c1e:
      if (*c != '#') {
        return;
      }
      do {
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00118c41:
          if (s->img_buffer_end <= s->img_buffer) goto LAB_00118bae;
        }
        else {
          iVar2 = (*(s->io).eof)(s->io_user_data);
          if (iVar2 != 0) {
            if (s->read_from_callbacks != 0) goto LAB_00118c41;
            goto LAB_00118bae;
          }
        }
        if ((*c == '\n') || (*c == '\r')) goto LAB_00118bae;
        sVar1 = stbi__get8(s);
        *c = sVar1;
      } while( true );
    }
LAB_00118bc8:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_00118bf4;
LAB_00118bd8:
    if ((4 < (byte)*c - 9) && (*c != 0x20)) goto LAB_00118bf4;
    sVar1 = stbi__get8(s);
    *c = sVar1;
  } while( true );
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   for (;;) {
      while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
         *c = (char) stbi__get8(s);

      if (stbi__at_eof(s) || *c != '#')
         break;

      while (!stbi__at_eof(s) && *c != '\n' && *c != '\r' )
         *c = (char) stbi__get8(s);
   }
}